

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  char *pcVar1;
  int iVar2;
  pointer __s;
  pointer piVar3;
  pointer pcVar4;
  size_type sVar5;
  int32_t iVar6;
  pointer peVar7;
  size_type sVar8;
  uint32_t h;
  long lVar9;
  long lVar10;
  long lVar11;
  int64_t iVar12;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __i;
  pointer peVar13;
  pointer peVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  iterator iVar16;
  string_view w;
  
  peVar14 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar14 != peVar7) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
              (peVar14,peVar7,
               (int)LZCOUNT(((long)peVar7 - (long)peVar14 >> 3) * -0x71c71c71c71c71c7) * 2 ^ 0x7e);
    if ((long)peVar7 - (long)peVar14 < 0x481) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar14,peVar7);
    }
    else {
      peVar13 = peVar14 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar14,peVar13);
      for (; peVar13 != peVar7; peVar13 = peVar13 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                  (peVar13);
      }
    }
  }
  peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  peVar13 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)peVar13 - (long)peVar7;
  lVar9 = (lVar11 >> 3) * -0x71c71c71c71c71c7 >> 2;
  peVar14 = peVar7;
  lVar10 = lVar11;
  if (0 < lVar9) {
    lVar10 = lVar9 + 1;
    peVar14 = peVar7 + 2;
    do {
      iVar12 = t;
      if (((peVar14[-2].type == word) || (iVar12 = tl, peVar14[-2].type == label)) &&
         (peVar14[-2].count < iVar12)) {
        peVar14 = peVar14 + -2;
        goto LAB_00126bf3;
      }
      iVar12 = t;
      if (((peVar14[-1].type == word) || (iVar12 = tl, peVar14[-1].type == label)) &&
         (peVar14[-1].count < iVar12)) {
        peVar14 = peVar14 + -1;
        goto LAB_00126bf3;
      }
      iVar12 = t;
      if (((peVar14->type == word) || (iVar12 = tl, peVar14->type == label)) &&
         (peVar14->count < iVar12)) goto LAB_00126bf3;
      iVar12 = t;
      if (((peVar14[1].type == word) || (iVar12 = tl, peVar14[1].type == label)) &&
         (peVar14[1].count < iVar12)) {
        peVar14 = peVar14 + 1;
        goto LAB_00126bf3;
      }
      lVar10 = lVar10 + -1;
      peVar14 = peVar14 + 4;
    } while (1 < lVar10);
    lVar10 = (long)peVar13 - (long)(peVar7 + lVar9 * 4);
    peVar14 = peVar7 + lVar9 * 4;
  }
  lVar10 = (lVar10 >> 3) * -0x71c71c71c71c71c7;
  iVar16._M_current = peVar13;
  if (lVar10 == 1) {
LAB_00126bb8:
    iVar12 = t;
    if (((peVar14->type != word) && (iVar12 = tl, peVar14->type != label)) ||
       (iVar12 <= peVar14->count)) goto LAB_00126c8c;
  }
  else if (lVar10 == 2) {
LAB_00126b98:
    iVar12 = t;
    if (((peVar14->type != word) && (iVar12 = tl, peVar14->type != label)) ||
       (iVar12 <= peVar14->count)) {
      peVar14 = peVar14 + 1;
      goto LAB_00126bb8;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_00126c8c;
    iVar12 = t;
    if (((peVar14->type != word) && (iVar12 = tl, peVar14->type != label)) ||
       (iVar12 <= peVar14->count)) {
      peVar14 = peVar14 + 1;
      goto LAB_00126b98;
    }
  }
LAB_00126bf3:
  iVar16._M_current = peVar14;
  if (peVar14 + 1 != peVar13 && peVar14 != peVar13) {
    pvVar15 = &peVar14[1].subwords;
    do {
      iVar12 = t;
      if (((*(char *)((long)(pvVar15 + -1) + 0x10) != '\0') &&
          (iVar12 = tl, *(char *)((long)(pvVar15 + -1) + 0x10) != '\x01')) ||
         (iVar12 <= *(long *)((long)(pvVar15 + -1) + 8))) {
        std::__cxx11::string::operator=((string *)peVar14,(string *)(pvVar15 + -2));
        peVar14->count = *(int64_t *)((long)(pvVar15 + -1) + 8);
        peVar14->type = *(entry_type *)((long)(pvVar15 + -1) + 0x10);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&peVar14->subwords,pvVar15);
        peVar14 = peVar14 + 1;
      }
      peVar7 = (pointer)(pvVar15 + 1);
      pvVar15 = pvVar15 + 3;
    } while (peVar7 != peVar13);
    peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(this->words_).
                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)peVar7;
    iVar16._M_current = peVar14;
  }
LAB_00126c8c:
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (&this->words_,iVar16,(entry *)((long)&(peVar7->word)._M_dataplus._M_p + lVar11));
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>,_true>::
    _S_do_it(&this->words_);
  }
  this->size_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  __s = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  piVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar3) {
    memset(__s,0xff,((long)piVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  peVar7 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar14 = (this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start; peVar14 != peVar7; peVar14 = peVar14 + 1) {
    pcVar4 = (peVar14->word)._M_dataplus._M_p;
    sVar5 = (peVar14->word)._M_string_length;
    h = 0x811c9dc5;
    if (sVar5 != 0) {
      sVar8 = 0;
      do {
        pcVar1 = pcVar4 + sVar8;
        sVar8 = sVar8 + 1;
        h = ((int)*pcVar1 ^ h) * 0x1000193;
      } while (sVar5 != sVar8);
    }
    w._M_str = pcVar4;
    w._M_len = sVar5;
    iVar6 = find(this,w,h);
    iVar2 = this->size_;
    this->size_ = iVar2 + 1;
    __s[iVar6] = iVar2;
    if (peVar14->type == label) {
      this->nlabels_ = this->nlabels_ + 1;
    }
    else if (peVar14->type == word) {
      this->nwords_ = this->nwords_ + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}